

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resizable_buffer.hpp
# Opt level: O2

void __thiscall
duckdb::ResizeableBuffer::resize(ResizeableBuffer *this,Allocator *allocator,uint64_t new_size)

{
  uint64_t uVar1;
  AllocatedData AStack_38;
  
  (this->super_ByteBuffer).len = new_size;
  if (new_size != 0) {
    if (this->alloc_len < new_size) {
      uVar1 = NextPowerOfTwo(new_size);
      this->alloc_len = uVar1;
      AllocatedData::Reset(&this->allocated_data);
      Allocator::Allocate(&AStack_38,allocator,this->alloc_len);
      AllocatedData::operator=(&this->allocated_data,&AStack_38);
      AllocatedData::~AllocatedData(&AStack_38);
      (this->super_ByteBuffer).ptr = (this->allocated_data).pointer;
    }
  }
  return;
}

Assistant:

void resize(Allocator &allocator, const uint64_t new_size) {
		len = new_size;
		if (new_size == 0) {
			return;
		}
		if (new_size > alloc_len) {
			alloc_len = NextPowerOfTwo(new_size);
			allocated_data.Reset(); // Have to reset before allocating new buffer (otherwise we use ~2x the memory)
			allocated_data = allocator.Allocate(alloc_len);
			ptr = allocated_data.get();
		}
	}